

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O0

Value * cmFileAPI::BuildVersion(Value *__return_storage_ptr__,uint major,uint minor)

{
  Value *pVVar1;
  Value local_80;
  Value local_48;
  undefined1 local_19;
  uint local_18;
  UInt local_14;
  uint minor_local;
  uint major_local;
  Value *version;
  
  local_19 = 0;
  local_18 = minor;
  local_14 = major;
  _minor_local = __return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,nullValue);
  Json::Value::Value(&local_48,local_14);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"major");
  Json::Value::operator=(pVVar1,&local_48);
  Json::Value::~Value(&local_48);
  Json::Value::Value(&local_80,local_18);
  pVVar1 = Json::Value::operator[](__return_storage_ptr__,"minor");
  Json::Value::operator=(pVVar1,&local_80);
  Json::Value::~Value(&local_80);
  return __return_storage_ptr__;
}

Assistant:

Json::Value cmFileAPI::BuildVersion(unsigned int major, unsigned int minor)
{
  Json::Value version;
  version["major"] = major;
  version["minor"] = minor;
  return version;
}